

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int nettlp_init(nettlp *nt)

{
  int iVar1;
  int *piVar2;
  long in_RDI;
  in_addr unaff_retaddr;
  int fd;
  uint16_t in_stack_fffffffffffffff8;
  uint16_t in_stack_fffffffffffffffa;
  in_addr in_stack_fffffffffffffffc;
  
  if (*(int *)(in_RDI + 0xc) == 0) {
    *(ushort *)(in_RDI + 0x14) = *(byte *)(in_RDI + 10) + 0x3000;
  }
  else {
    if (*(int *)(in_RDI + 0xc) != 1) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      return -1;
    }
    *(ushort *)(in_RDI + 0x14) = (*(byte *)(in_RDI + 10) & 0xf) + 0x4000;
  }
  iVar1 = nettlp_create_udp_socket
                    (unaff_retaddr,in_stack_fffffffffffffffa,in_stack_fffffffffffffffc,
                     in_stack_fffffffffffffff8);
  if (-1 < iVar1) {
    *(int *)(in_RDI + 0x10) = iVar1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nettlp_init(struct nettlp *nt)
{
	int fd;

	switch (nt->dir) {
	case DMA_ISSUED_BY_LIBTLP:
		nt->port = NETTLP_LIBTLP_PORT_BASE + nt->tag;
		break;
	case DMA_ISSUED_BY_ADAPTER:
		nt->port = NETTLP_ADAPTER_PORT_BASE + (nt->tag & 0x0F);
		break;
	default:
		errno = EINVAL;
		return -1;
	}

	fd = nettlp_create_udp_socket(nt->remote_addr, nt->port,
				      nt->local_addr, nt->port);
	if (fd < 0)
		return fd;

	nt->sockfd = fd;

	return 0;
}